

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_server.c
# Opt level: O1

void mk_server_worker_loop(mk_server *server)

{
  uint uVar1;
  mk_event_loop *loop;
  mk_list *pmVar2;
  mk_list *pmVar3;
  bool bVar4;
  mk_list *pmVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  mk_sched_worker *sched;
  ssize_t sVar9;
  uint *puVar10;
  void *pvVar11;
  void *pvVar12;
  int *piVar13;
  char *pcVar14;
  mk_sched_conn *data;
  mk_list *__mptr;
  long lVar15;
  mk_server_listen *unaff_R13;
  long lVar16;
  uint64_t val;
  char buf [128];
  long local_d0;
  long local_c8;
  void *local_c0;
  char local_b8 [136];
  
  sched = (mk_sched_worker *)pthread_getspecific(mk_tls_sched_worker_node);
  loop = sched->loop;
  mk_event_wait(loop);
  pvVar12 = loop->data;
  if (0 < loop->n_events) {
    unaff_R13 = *(mk_server_listen **)(*(long *)((long)pvVar12 + 8) + 4);
  }
  local_c8 = 0xeeeeeeee;
  if (0 < loop->n_events) {
    lVar16 = 0x10;
    lVar15 = 0;
    do {
      if (((((unaff_R13->event).mask & 1) != 0) && ((unaff_R13->event).type == 0)) &&
         (iVar6 = (unaff_R13->event).fd, iVar6 == sched->signal_channel_r)) {
        sVar9 = read(iVar6,&local_d0,8);
        if ((int)sVar9 < 0) {
          puVar10 = (uint *)__errno_location();
          uVar1 = *puVar10;
          pcVar14 = strerror_r(uVar1,local_b8,0x80);
          if (pcVar14 != (char *)0x0) {
            mk_print(0x1001,"strerror_r() failed");
          }
          mk_print(0x1001,"%s: %s, errno=%i at %s:%i","read",local_b8,(ulong)uVar1,
                   "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_server/mk_server.c"
                   ,0x1d6);
        }
        else if (local_d0 == 0xeeeeeeee) break;
      }
      lVar15 = lVar15 + 1;
      if (lVar15 < loop->n_events) {
        unaff_R13 = *(mk_server_listen **)(*(long *)((long)pvVar12 + 8) + lVar16);
      }
      else {
        unaff_R13 = (mk_server_listen *)0x0;
      }
      lVar16 = lVar16 + 0xc;
    } while (lVar15 < loop->n_events);
  }
  if (server->scheduler_mode == '\x01') {
    pvVar11 = pthread_getspecific(mk_tls_server_listen);
    for (pvVar12 = *(void **)((long)pvVar11 + 8); pvVar12 != pvVar11;
        pvVar12 = *(void **)((long)pvVar12 + 8)) {
      mk_event_add(sched->loop,*(int *)((long)pvVar12 + -0x20),1,1,(void *)((long)pvVar12 + -0x68));
    }
  }
  if (((server->lib_mode == 1) &&
      (pvVar12 = pthread_getspecific(mk_server_fifo_key), pvVar12 != (void *)0x0)) &&
     (iVar6 = mk_event_add(loop,*(int *)((long)pvVar12 + 0x4c),2,1,pvVar12), iVar6 != 0)) {
    piVar13 = __errno_location();
    pcVar14 = strerror(*piVar13);
    mk_print(0x1001,"[server] Error registering fifo worker channel: %s",pcVar14);
  }
  pvVar12 = calloc(1,0x48);
  pthread_setspecific(mk_tls_server_timeout,pvVar12);
  local_c0 = pvVar12;
  iVar6 = mk_event_timeout_create(loop,(long)server->timeout,0,pvVar12);
  local_c8 = local_c8 + 0x10ff1112;
  do {
    mk_event_wait(loop);
    pvVar12 = loop->data;
    if (0 < loop->n_events) {
      unaff_R13 = *(mk_server_listen **)(*(long *)((long)pvVar12 + 8) + 4);
    }
    bVar4 = 0 < loop->n_events;
    if (0 < loop->n_events) {
      lVar15 = 0x10;
      lVar16 = 0;
      do {
        uVar1 = (unaff_R13->event).type;
        if ((uVar1 & 0x18) == 0) {
          switch(uVar1) {
          case 0:
            sVar9 = read((unaff_R13->event).fd,&local_d0,8);
            if ((int)sVar9 < 0) {
              mk_server_worker_loop_cold_3();
            }
            else {
              iVar7 = (unaff_R13->event).fd;
              if (iVar7 == sched->signal_channel_r) {
                if (local_d0 == local_c8) {
                  if (0 < iVar6) {
                    mk_event_timeout_destroy(loop,local_c0);
                  }
                  pvVar12 = pthread_getspecific(mk_tls_server_timeout);
                  free(pvVar12);
                  mk_server_listen_exit(sched->listeners);
                  mk_event_loop_destroy(loop);
                  mk_sched_worker_free(server);
                  goto LAB_0010fc34;
                }
              }
              else if (iVar7 == iVar6) {
                mk_sched_check_timeouts(sched,server);
              }
            }
            break;
          case 1:
            iVar7 = mk_socket_accept(unaff_R13->server_fd);
            if (iVar7 != -1) {
              data = mk_sched_add_connection(iVar7,unaff_R13,sched,server);
              if (data != (mk_sched_conn *)0x0) {
                iVar8 = mk_event_add(sched->loop,iVar7,3,1,data);
                if (iVar8 == 0) {
                  sched->accepted_connections = sched->accepted_connections + 1;
                  break;
                }
                mk_server_worker_loop_cold_1();
              }
              (*unaff_R13->network->network->close)(unaff_R13->network,iVar7);
            }
            break;
          case 2:
            mk_fifo_worker_read(unaff_R13);
            break;
          case 3:
            mk_server_worker_loop_cold_2();
            break;
          case 4:
            (*(unaff_R13->event).handler)(unaff_R13);
            break;
          case 5:
            mk_http_thread_event(&unaff_R13->event);
          }
        }
        lVar16 = lVar16 + 1;
        if (lVar16 < loop->n_events) {
          unaff_R13 = *(mk_server_listen **)(*(long *)((long)pvVar12 + 8) + lVar15);
        }
        else {
          unaff_R13 = (mk_server_listen *)0x0;
        }
        lVar15 = lVar15 + 0xc;
        bVar4 = lVar16 < loop->n_events;
      } while (lVar16 < loop->n_events);
    }
    mk_sched_threads_purge(sched);
    pmVar5 = (sched->event_free_queue).next;
    while (pmVar5 != &sched->event_free_queue) {
      pmVar2 = pmVar5->prev;
      pmVar3 = pmVar5->next;
      pmVar2->next = pmVar3;
      pmVar3->prev = pmVar2;
      pmVar5->prev = (mk_list *)0x0;
      pmVar5->next = (mk_list *)0x0;
      free(pmVar5 + -2);
      pmVar5 = pmVar3;
    }
LAB_0010fc34:
    if (bVar4) {
      return;
    }
  } while( true );
}

Assistant:

void mk_server_worker_loop(struct mk_server *server)
{
    int ret = -1;
    int timeout_fd;
    uint64_t val;
    struct mk_event *event;
    struct mk_event_loop *evl;
    struct mk_list *list;
    struct mk_list *head;
    struct mk_sched_conn *conn;
    struct mk_sched_worker *sched;
    struct mk_server_listen *listener;
    struct mk_server_timeout *server_timeout;

    /* Get thread conf */
    sched = mk_sched_get_thread_conf();
    evl = sched->loop;

    /*
     * The worker will NOT process any connection until the master
     * process through mk_server_loop() send us the green light
     * signal MK_SERVER_SIGNAL_START.
     */
    mk_event_wait(evl);
    mk_event_foreach(event, evl) {
        if ((event->mask & MK_EVENT_READ) &&
            event->type == MK_EVENT_NOTIFICATION) {
            if (event->fd == sched->signal_channel_r) {
        /* When using libevent _mk_event_channel_create creates a unix socket
         * instead of a pipe and windows doesn't us calling read / write on a
         * socket instead of recv / send
         */
#ifdef _WIN32
                ret = recv(event->fd, &val, sizeof(val), MSG_WAITALL);
#else
                ret = read(event->fd, &val, sizeof(val));
#endif
                if (ret < 0) {
                    mk_libc_error("read");
                    continue;
                }
                if (val == MK_SERVER_SIGNAL_START) {
                    MK_TRACE("Worker %i started (SIGNAL_START)", sched->idx);
                    break;
                }
            }
        }
    }

    if (server->scheduler_mode == MK_SCHEDULER_REUSEPORT) {
        /* Register listeners */
        list = MK_TLS_GET(mk_tls_server_listen);
        mk_list_foreach(head, list) {
            listener = mk_list_entry(head, struct mk_server_listen, _head);
            mk_event_add(sched->loop, listener->server_fd,
                         MK_EVENT_LISTENER, MK_EVENT_READ,
                         listener);
        }
    }

    /*
     * If running in library mode, register the FIFO pipe file descriptors
     * into the main event loop.
     */
    if (server->lib_mode == MK_TRUE) {
        mk_server_fifo_worker_setup(evl);
    }

    /* create a new timeout file descriptor */
    server_timeout = mk_mem_alloc_z(sizeof(struct mk_server_timeout));
    MK_TLS_SET(mk_tls_server_timeout, server_timeout);
    timeout_fd = mk_event_timeout_create(evl, server->timeout, 0, server_timeout);

    while (1) {
        mk_event_wait(evl);
        mk_event_foreach(event, evl) {
            ret = 0;
            if (event->type & MK_EVENT_IDLE) {
                continue;
            }

            if (event->type == MK_EVENT_CONNECTION) {
                conn = (struct mk_sched_conn *) event;

                if (event->mask & MK_EVENT_WRITE) {
                    MK_TRACE("[FD %i] Event WRITE", event->fd);
                    ret = mk_sched_event_write(conn, sched, server);
                }

                if (event->mask & MK_EVENT_READ) {
                    MK_TRACE("[FD %i] Event READ", event->fd);
                    ret = mk_sched_event_read(conn, sched, server);
                }


                if (event->mask & MK_EVENT_CLOSE && ret != -1) {
                    MK_TRACE("[FD %i] Event CLOSE", event->fd);
                    ret = -1;
                }

                if (ret < 0 && conn->status != MK_SCHED_CONN_CLOSED) {
                    MK_TRACE("[FD %i] Event FORCE CLOSE | ret = %i",
                             event->fd, ret);
                    mk_sched_event_close(conn, sched, MK_EP_SOCKET_CLOSED,
                                         server);
                }
            }
            else if (event->type == MK_EVENT_LISTENER) {
                /*
                 * A new connection have been accepted..or failed, despite
                 * the result, we let the loop continue processing the other
                 * events triggered.
                 */
                conn = mk_server_listen_handler(sched, event, server);
                if (conn) {
                    //conn->event.mask = MK_EVENT_READ
                    //goto speed;
                }
                continue;
            }
            else if (event->type == MK_EVENT_CUSTOM) {
                /*
                 * We got an event associated to a custom interface, that
                 * means a plugin registered some file descriptor on this
                 * event loop and an event was triggered. We pass the control
                 * to the defined event handler.
                 */
                event->handler(event);
            }
            else if (event->type == MK_EVENT_NOTIFICATION) {
#ifdef _WIN32
                ret = recv(event->fd, &val, sizeof(val), MSG_WAITALL);
#else
                ret = read(event->fd, &val, sizeof(val));
#endif
                if (ret < 0) {
                    mk_libc_error("read");
                    continue;
                }

                if (event->fd == sched->signal_channel_r) {
                    if (val == MK_SCHED_SIGNAL_DEADBEEF) {
                        //FIXME:mk_sched_sync_counters();
                        continue;
                    }
                    else if (val == MK_SCHED_SIGNAL_FREE_ALL) {
                        if (timeout_fd > 0) {
                            mk_event_timeout_destroy(evl, server_timeout);
                        }
                        mk_mem_free(MK_TLS_GET(mk_tls_server_timeout));
                        mk_server_listen_exit(sched->listeners);
                        mk_event_loop_destroy(evl);
                        mk_sched_worker_free(server);
                        return;
                    }
                    else if (val == MK_SCHED_SIGNAL_EVENT_LOOP_BREAK) {
                        /* NOTE: This is just a notification that's sent to break out
                         *       of the libevent loop in windows after accepting a new
                         *       client
                        */
                        MK_TRACE("New client accepted, awesome!");
                    }
                }
                else if (event->fd == timeout_fd) {
                    mk_sched_check_timeouts(sched, server);
                }
                continue;
            }
            else if (event->type == MK_EVENT_THREAD) {
                mk_http_thread_event(event);
                continue;
            }
            else if (event->type == MK_EVENT_FIFO) {
                mk_fifo_worker_read(event);
                continue;
            }
        }
        mk_sched_threads_purge(sched);
        mk_sched_event_free_all(sched);
    }
}